

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlWriter *name;
  long in_RDI;
  SectionInfo *in_stack_ffffffffffffff08;
  StreamingReporterBase *in_stack_ffffffffffffff10;
  string *attribute;
  string *in_stack_ffffffffffffff18;
  XmlWriter *this_00;
  string *in_stack_ffffffffffffff48;
  string local_b0 [32];
  string local_90 [39];
  undefined1 local_69 [57];
  string local_30 [48];
  
  StreamingReporterBase::sectionStarting(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = *(int *)(in_RDI + 0x218);
  *(int *)(in_RDI + 0x218) = iVar1 + 1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Section",(allocator *)(local_69 + 0x38));
    XmlWriter::startElement((XmlWriter *)in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->name)
    ;
    this_00 = (XmlWriter *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_69 + 1),"name",(allocator *)this_00);
    trim(in_stack_ffffffffffffff48);
    name = XmlWriter::writeAttribute
                     (this_00,in_stack_ffffffffffffff18,(string *)in_stack_ffffffffffffff10);
    attribute = (string *)&stack0xffffffffffffff4f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"description",(allocator *)attribute);
    XmlWriter::writeAttribute(this_00,(string *)name,attribute);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)(local_69 + 0x38));
  }
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) {
            StreamingReporterBase::sectionStarting( sectionInfo );
            if( m_sectionDepth++ > 0 ) {
                m_xml.startElement( "Section" )
                    .writeAttribute( "name", trim( sectionInfo.name ) )
                    .writeAttribute( "description", sectionInfo.description );
            }
        }